

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O2

void test_fill_stipples(Am_Drawonable *d)

{
  Am_Style light_gray_opaque;
  Am_Style light_gray_stipple;
  
  Am_Style::Halftone_Stipple((int)&light_gray_stipple,0x1e);
  Am_Style::Halftone_Stipple((int)&light_gray_opaque,0x1e);
  (**(code **)(*(long *)d + 0x160))(d,&black,&red,0x3c,0x14,0x4b,0x4b,0);
  (**(code **)(*(long *)d + 0x160))(d,&Am_No_Style,&light_gray_stipple,0x46,0x1e,0x37,0x37,0);
  (**(code **)(*(long *)d + 0x160))(d,&blue,&green,0x3c,0x78,0x4b,0x4b,0);
  (**(code **)(*(long *)d + 0x160))(d,&black,&light_gray_opaque,0x46,0x82,0x37,0x37);
  (**(code **)(*(long *)d + 0xa0))(d);
  Am_Style::~Am_Style(&light_gray_opaque);
  Am_Style::~Am_Style(&light_gray_stipple);
  return;
}

Assistant:

void
test_fill_stipples(Am_Drawonable *d)
{
  Am_Style light_gray_stipple = Am_Style::Halftone_Stipple(30);
  Am_Style light_gray_opaque =
      Am_Style::Halftone_Stipple(30, Am_FILL_OPAQUE_STIPPLED);

  d->Draw_Rectangle(black, red, 60, 20, 75, 75);
  d->Draw_Rectangle(Am_No_Style, light_gray_stipple, 70, 30, 55, 55);

  d->Draw_Rectangle(blue, green, 60, 120, 75, 75);
  d->Draw_Rectangle(black, light_gray_opaque, 70, 130, 55, 55);
  d->Flush_Output();
}